

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_huge(chunk *c,loc_conflict centre,wchar_t rating)

{
  wchar_t w;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint32_t uVar6;
  wchar_t y1;
  wchar_t h;
  bool bVar7;
  wchar_t x1;
  loc_conflict centre_local;
  
  centre_local.y = centre.y;
  bVar7 = true;
  if (centre_local.y < c->height) {
    centre_local.x = centre.x;
    bVar7 = c->width <= centre_local.x;
  }
  centre_local = centre;
  uVar2 = Rand_div(10);
  uVar3 = Rand_div(0x32);
  if ((dun->cent_n - dun->nstair_room <= (int)(uint)(bVar7 ^ 1)) &&
     (uVar4 = Rand_div(0x14), uVar4 == 0)) {
    h = uVar2 + L'\x1e';
    w = uVar3 + L'-';
    uVar4 = Rand_div(3);
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,w);
    if ((bVar7 == false) || (_Var1 = find_space(&centre_local,h,w), _Var1)) {
      y1 = centre_local.y - h / 2;
      x1 = centre_local.x - w / 2;
      _Var1 = generate_starburst_room
                        (c,y1,x1,y1 + uVar2 + L'\x1d',uVar3 + 0x2c + x1,uVar4 != 0,L'\x01',false);
      if (_Var1) {
        uVar2 = Rand_div(5);
        if (1 < (int)uVar2) {
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"rubble");
          uVar2 = Rand_div(2);
          iVar5 = (uVar2 + 1) * w * h;
          if (1099 < iVar5) {
            iVar5 = iVar5 / 0x44c;
            do {
              uVar2 = Rand_div(0x10);
              uVar3 = Rand_div(0x18);
              uVar4 = Rand_div(h - (uVar2 + 8));
              uVar6 = Rand_div(w - (uVar3 + 10));
              generate_starburst_room
                        (c,uVar4 + y1,uVar6 + x1,uVar4 + y1 + uVar2 + L'\b',uVar3 + 10 + uVar6 + x1,
                         false,L'\x18',false);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
        }
        if ((player->opts).opt[0x18] != true) {
          return true;
        }
        msg("Huge room");
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool build_huge(struct chunk *c, struct loc centre, int rating)
{
	bool finding_space = centre.y >= c->height || centre.x >= c->width;
	bool light;

	int i, count;

	int y1, x1, y2, x2;
	int y1_tmp, x1_tmp, y2_tmp, x2_tmp;
	int width_tmp, height_tmp;

	int height = 30 + randint0(10);
	int width = 45 + randint0(50);

	/*
	 * Only try to build a huge room as the first non-staircase room.  If
	 * not finding space, cent_n has already been increment.
	 */
	if (dun->cent_n - dun->nstair_room > ((finding_space) ? 0 : 1))
		return false;

	/* Flat 5% chance */
	if (!one_in_(20)) return false;

	/* This room is usually lit. */
	light = !one_in_(3);

	/* Find and reserve some space.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height, width);
	if (finding_space) {
		if (!find_space(&centre, height, width))
			return (false);
	}

	/* Locate the room */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;

	/* Make a huge starburst room with optional light. */
	if (!generate_starburst_room(c, y1, x1, y2, x2, light, FEAT_FLOOR, false))
		return (false);

	/* Often, add rubble to break things up a bit. */
	if (randint1(5) > 2) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "rubble");

		/* Determine how many rubble fields to add (between 1 and 6). */
		count = height * width * randint1(2) / 1100;

		/* Make the rubble fields. */
		for (i = 0; i < count; i++) {
			height_tmp = 8 + randint0(16);
			width_tmp = 10 + randint0(24);

			/* Semi-random location. */
			y1_tmp = y1 + randint0(height - height_tmp);
			x1_tmp = x1 + randint0(width - width_tmp);
			y2_tmp = y1_tmp + height_tmp;
			x2_tmp = x1_tmp + width_tmp;

			/* Make the rubble field. */
			generate_starburst_room(c, y1_tmp, x1_tmp, y2_tmp, x2_tmp,
									false, FEAT_PASS_RUBBLE, false);
		}
	}

	/* Describe */
	ROOM_LOG("Huge room");

	/* Success. */
	return (true);
}